

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O0

void HTS_Engine_save_label(HTS_Engine *engine,FILE *fp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  ulong uVar8;
  FILE *in_RSI;
  undefined8 *in_RDI;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double rate;
  size_t nstate;
  HTS_SStreamSet *sss;
  HTS_Label *label;
  size_t duration;
  size_t state;
  size_t frame;
  size_t j;
  size_t i;
  long local_38;
  size_t local_30;
  long local_28;
  ulong local_20;
  ulong local_18;
  
  sVar3 = HTS_ModelSet_get_nstate((HTS_ModelSet *)(in_RDI + 0x16));
  uVar1 = in_RDI[1];
  auVar12._8_4_ = (int)((ulong)uVar1 >> 0x20);
  auVar12._0_8_ = uVar1;
  auVar12._12_4_ = 0x45300000;
  uVar2 = *in_RDI;
  auVar15._8_4_ = (int)((ulong)uVar2 >> 0x20);
  auVar15._0_8_ = uVar2;
  auVar15._12_4_ = 0x45300000;
  dVar9 = (((auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * 10000000.0) /
          ((auVar15._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  local_18 = 0;
  local_30 = 0;
  local_28 = 0;
  while( true ) {
    sVar4 = HTS_Label_get_size((HTS_Label *)(in_RDI + 0x25));
    if (sVar4 <= local_18) break;
    local_38 = 0;
    for (local_20 = 0; local_20 < sVar3; local_20 = local_20 + 1) {
      sVar4 = HTS_SStreamSet_get_duration((HTS_SStreamSet *)(in_RDI + 0x27),local_30);
      local_38 = sVar4 + local_38;
      local_30 = local_30 + 1;
    }
    auVar13._8_4_ = (int)((ulong)local_28 >> 0x20);
    auVar13._0_8_ = local_28;
    auVar13._12_4_ = 0x45300000;
    dVar10 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_28) - 4503599627370496.0)) * dVar9;
    uVar8 = (ulong)dVar10;
    lVar5 = local_28 + local_38;
    auVar14._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar14._0_8_ = lVar5;
    auVar14._12_4_ = 0x45300000;
    dVar11 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * dVar9;
    uVar6 = (ulong)dVar11;
    pcVar7 = HTS_Label_get_string((HTS_Label *)(in_RDI + 0x25),local_18);
    fprintf(in_RSI,"%lu %lu %s\n",
            uVar8 | (long)(dVar10 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f,
            uVar6 | (long)(dVar11 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f,pcVar7);
    local_28 = local_38 + local_28;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void HTS_Engine_save_label(HTS_Engine * engine, FILE * fp)
{
   size_t i, j;
   size_t frame, state, duration;

   HTS_Label *label = &engine->label;
   HTS_SStreamSet *sss = &engine->sss;
   size_t nstate = HTS_ModelSet_get_nstate(&engine->ms);
   double rate = engine->condition.fperiod * 1.0e+07 / engine->condition.sampling_frequency;

   for (i = 0, state = 0, frame = 0; i < HTS_Label_get_size(label); i++) {
      for (j = 0, duration = 0; j < nstate; j++)
         duration += HTS_SStreamSet_get_duration(sss, state++);
      fprintf(fp, "%lu %lu %s\n", (unsigned long) (frame * rate), (unsigned long) ((frame + duration) * rate), HTS_Label_get_string(label, i));
      frame += duration;
   }
}